

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_frame.c
# Opt level: O0

nghttp2_settings_entry *
nghttp2_frame_iv_copy(nghttp2_settings_entry *iv,size_t niv,nghttp2_mem *mem)

{
  size_t size;
  size_t len;
  nghttp2_settings_entry *iv_copy;
  nghttp2_mem *mem_local;
  size_t niv_local;
  nghttp2_settings_entry *iv_local;
  
  size = niv << 3;
  if (size == 0) {
    iv_local = (nghttp2_settings_entry *)0x0;
  }
  else {
    iv_local = (nghttp2_settings_entry *)nghttp2_mem_malloc(mem,size);
    if (iv_local == (nghttp2_settings_entry *)0x0) {
      iv_local = (nghttp2_settings_entry *)0x0;
    }
    else {
      memcpy(iv_local,iv,size);
    }
  }
  return iv_local;
}

Assistant:

nghttp2_settings_entry *nghttp2_frame_iv_copy(const nghttp2_settings_entry *iv,
                                              size_t niv, nghttp2_mem *mem) {
  nghttp2_settings_entry *iv_copy;
  size_t len = niv * sizeof(nghttp2_settings_entry);

  if (len == 0) {
    return NULL;
  }

  iv_copy = nghttp2_mem_malloc(mem, len);

  if (iv_copy == NULL) {
    return NULL;
  }

  memcpy(iv_copy, iv, len);

  return iv_copy;
}